

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make.cc
# Opt level: O0

bool __thiscall
GNUmakeTokenPool::Setup(GNUmakeTokenPool *this,bool ignore,bool verbose,double *max_load_average)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  allocator<char> local_f1;
  string local_f0;
  int local_cc;
  char *pcStack_c8;
  int load_limit;
  char *l_arg;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_88 [8];
  LinePrinter printer;
  char *jobserver;
  char *value;
  double *max_load_average_local;
  bool verbose_local;
  bool ignore_local;
  GNUmakeTokenPool *this_local;
  char *__haystack;
  
  iVar2 = (*(this->super_TokenPool)._vptr_TokenPool[8])(this,"MAKEFLAGS");
  __haystack = (char *)CONCAT44(extraout_var,iVar2);
  if (__haystack == (char *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_001596f1;
  }
  printer.output_buffer_.field_2._8_8_ = strstr(__haystack,"--jobserver-fds=");
  if ((char *)printer.output_buffer_.field_2._8_8_ == (char *)0x0) {
    printer.output_buffer_.field_2._8_8_ = strstr(__haystack,"--jobserver-auth=");
  }
  if (printer.output_buffer_.field_2._8_8_ != 0) {
    LinePrinter::LinePrinter((LinePrinter *)local_88);
    if (ignore) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,
                 "ninja: warning: -jN forced on command line; ignoring GNU make jobserver.\n",
                 &local_a9);
      LinePrinter::PrintOnNewLine((LinePrinter *)local_88,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
LAB_001596bf:
      bVar1 = false;
    }
    else {
      uVar3 = (*(this->super_TokenPool)._vptr_TokenPool[9])
                        (this,printer.output_buffer_.field_2._8_8_);
      if ((uVar3 & 1) == 0) goto LAB_001596bf;
      pcStack_c8 = strstr(__haystack," -l");
      local_cc = -1;
      if (verbose) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"ninja: using GNU make jobserver.\n",&local_f1);
        LinePrinter::PrintOnNewLine((LinePrinter *)local_88,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator(&local_f1);
      }
      if (((pcStack_c8 != (char *)0x0) &&
          (iVar2 = __isoc99_sscanf(pcStack_c8 + 3,"%d ",&local_cc), iVar2 == 1)) && (0 < local_cc))
      {
        *max_load_average = (double)local_cc;
      }
      this_local._7_1_ = 1;
      bVar1 = true;
    }
    LinePrinter::~LinePrinter((LinePrinter *)local_88);
    if (bVar1) goto LAB_001596f1;
  }
  this_local._7_1_ = 0;
LAB_001596f1:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GNUmakeTokenPool::Setup(bool ignore,
                             bool verbose,
                             double& max_load_average) {
  const char* value = GetEnv("MAKEFLAGS");
  if (!value)
    return false;

  // GNU make <= 4.1
  const char* jobserver = strstr(value, "--jobserver-fds=");
  if (!jobserver)
    // GNU make => 4.2
    jobserver = strstr(value, "--jobserver-auth=");
  if (jobserver) {
    LinePrinter printer;

    if (ignore) {
      printer.PrintOnNewLine("ninja: warning: -jN forced on command line; ignoring GNU make jobserver.\n");
    } else {
      if (ParseAuth(jobserver)) {
        const char* l_arg = strstr(value, " -l");
        int load_limit = -1;

        if (verbose) {
          printer.PrintOnNewLine("ninja: using GNU make jobserver.\n");
        }

        // translate GNU make -lN to ninja -lN
        if (l_arg &&
            (sscanf(l_arg + 3, "%d ", &load_limit) == 1) &&
            (load_limit > 0)) {
          max_load_average = load_limit;
        }

        return true;
      }
    }
  }

  return false;
}